

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void __thiscall mir::inst::PhiInst::display(PhiInst *this,ostream *o)

{
  pointer pVVar1;
  long lVar2;
  ulong uVar3;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::__ostream_insert<char,std::char_traits<char>>(o," = phi [",8);
  pVVar1 = (this->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
        pVVar1 = (pointer)((long)&(((this->vars).
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_Displayable).
                                  _vptr_Displayable + lVar2);
      }
      (**(pVVar1->super_Displayable)._vptr_Displayable)(pVVar1,o);
      uVar3 = uVar3 + 1;
      pVVar1 = (this->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->vars).
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"]",1);
  return;
}

Assistant:

void PhiInst::display(std::ostream& o) const {
  o << dest << " = phi [";
  for (size_t i = 0; i < vars.size(); i++) {
    if (i != 0) o << ", ";
    o << vars[i];
  }
  o << "]";
}